

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O0

LRUHandle ** __thiscall
leveldb::anon_unknown_0::HandleTable::FindPointer(HandleTable *this,Slice *key,uint32_t hash)

{
  long lVar1;
  uint in_EDX;
  LRUHandle *in_RSI;
  int *in_RDI;
  long in_FS_OFFSET;
  LRUHandle **ptr;
  Slice *in_stack_ffffffffffffffb0;
  LRUHandle *x;
  bool local_3a;
  bool local_39;
  LRUHandle **local_38;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = (LRUHandle **)(*(long *)(in_RDI + 2) + (ulong)(in_EDX & *in_RDI - 1U) * 8);
  while( true ) {
    local_39 = false;
    if (*local_38 != (LRUHandle *)0x0) {
      local_3a = true;
      if ((*local_38)->hash == in_EDX) {
        x = in_RSI;
        LRUHandle::key(in_RSI);
        local_3a = leveldb::operator!=((Slice *)x,in_stack_ffffffffffffffb0);
      }
      local_39 = local_3a;
    }
    if (local_39 == false) break;
    local_38 = &(*local_38)->next_hash;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_38;
  }
  __stack_chk_fail();
}

Assistant:

LRUHandle** FindPointer(const Slice& key, uint32_t hash) {
    LRUHandle** ptr = &list_[hash & (length_ - 1)];
    while (*ptr != nullptr && ((*ptr)->hash != hash || key != (*ptr)->key())) {
      ptr = &(*ptr)->next_hash;
    }
    return ptr;
  }